

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O2

xmlNsPtr xmlNewNs(xmlNodePtr node,xmlChar *href,xmlChar *prefix)

{
  _xmlNs *p_Var1;
  int iVar2;
  xmlNsPtr cur;
  xmlChar *pxVar3;
  xmlNs *pxVar4;
  
  if (((node == (xmlNodePtr)0x0) || (node->type == XML_ELEMENT_NODE)) &&
     ((prefix == (xmlChar *)0x0 ||
      ((iVar2 = xmlStrEqual(prefix,"xml"), iVar2 == 0 ||
       (iVar2 = xmlStrEqual(href,(xmlChar *)"http://www.w3.org/XML/1998/namespace"), iVar2 == 0)))))
     ) {
    cur = (xmlNsPtr)(*xmlMalloc)(0x30);
    if (cur == (xmlNsPtr)0x0) {
      xmlTreeErrMemory("building namespace");
    }
    else {
      cur->next = (_xmlNs *)0x0;
      *(undefined8 *)&cur->type = 0;
      cur->_private = (void *)0x0;
      cur->context = (_xmlDoc *)0x0;
      cur->href = (xmlChar *)0x0;
      cur->prefix = (xmlChar *)0x0;
      cur->type = XML_NAMESPACE_DECL;
      if (href != (xmlChar *)0x0) {
        pxVar3 = xmlStrdup(href);
        cur->href = pxVar3;
      }
      if (prefix != (xmlChar *)0x0) {
        pxVar3 = xmlStrdup(prefix);
        cur->prefix = pxVar3;
      }
      if (node == (xmlNodePtr)0x0) {
        return cur;
      }
      pxVar4 = node->nsDef;
      if (pxVar4 == (xmlNs *)0x0) {
        node->nsDef = cur;
        return cur;
      }
      if (pxVar4->prefix != (xmlChar *)0x0 || cur->prefix != (xmlChar *)0x0) {
        iVar2 = xmlStrEqual(pxVar4->prefix,cur->prefix);
        while (iVar2 == 0) {
          p_Var1 = pxVar4->next;
          if (p_Var1 == (_xmlNs *)0x0) {
            pxVar4->next = cur;
            return cur;
          }
          if (p_Var1->prefix == (xmlChar *)0x0 && cur->prefix == (xmlChar *)0x0) break;
          iVar2 = xmlStrEqual(p_Var1->prefix,cur->prefix);
          pxVar4 = p_Var1;
        }
      }
      xmlFreeNs(cur);
    }
  }
  return (xmlNsPtr)0x0;
}

Assistant:

xmlNsPtr
xmlNewNs(xmlNodePtr node, const xmlChar *href, const xmlChar *prefix) {
    xmlNsPtr cur;

    if ((node != NULL) && (node->type != XML_ELEMENT_NODE))
	return(NULL);

    if ((prefix != NULL) && (xmlStrEqual(prefix, BAD_CAST "xml"))) {
        /* xml namespace is predefined, no need to add it */
        if (xmlStrEqual(href, XML_XML_NAMESPACE))
            return(NULL);

        /*
         * Problem, this is an attempt to bind xml prefix to a wrong
         * namespace, which breaks
         * Namespace constraint: Reserved Prefixes and Namespace Names
         * from XML namespace. But documents authors may not care in
         * their context so let's proceed.
         */
    }

    /*
     * Allocate a new Namespace and fill the fields.
     */
    cur = (xmlNsPtr) xmlMalloc(sizeof(xmlNs));
    if (cur == NULL) {
	xmlTreeErrMemory("building namespace");
	return(NULL);
    }
    memset(cur, 0, sizeof(xmlNs));
    cur->type = XML_LOCAL_NAMESPACE;

    if (href != NULL)
	cur->href = xmlStrdup(href);
    if (prefix != NULL)
	cur->prefix = xmlStrdup(prefix);

    /*
     * Add it at the end to preserve parsing order ...
     * and checks for existing use of the prefix
     */
    if (node != NULL) {
	if (node->nsDef == NULL) {
	    node->nsDef = cur;
	} else {
	    xmlNsPtr prev = node->nsDef;

	    if (((prev->prefix == NULL) && (cur->prefix == NULL)) ||
		(xmlStrEqual(prev->prefix, cur->prefix))) {
		xmlFreeNs(cur);
		return(NULL);
	    }
	    while (prev->next != NULL) {
	        prev = prev->next;
		if (((prev->prefix == NULL) && (cur->prefix == NULL)) ||
		    (xmlStrEqual(prev->prefix, cur->prefix))) {
		    xmlFreeNs(cur);
		    return(NULL);
		}
	    }
	    prev->next = cur;
	}
    }
    return(cur);
}